

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  undefined4 uVar1;
  ZSTD_compressionParameters cParams;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  ZSTD_TraceCtx ZVar6;
  size_t code;
  undefined4 in_stack_ffffffffffffff54;
  ZSTD_strategy in_stack_ffffffffffffff58;
  ZSTD_CCtx *local_a0;
  size_t local_90;
  size_t err_code_1;
  size_t dictID;
  size_t err_code;
  size_t dictContentSize;
  ZSTD_CDict *cdict_local;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  ZSTD_dictContentType_e dictContentType_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  local_90 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    local_90 = cdict->dictContentSize;
  }
  ZVar6 = ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar6;
  uVar1 = (params->cParams).targetLength;
  uVar2 = (params->cParams).hashLog;
  uVar3 = (params->cParams).searchLog;
  uVar4 = (params->cParams).minMatch;
  cParams.hashLog = uVar4;
  cParams.chainLog = uVar3;
  cParams.windowLog = uVar2;
  cParams.searchLog = uVar1;
  cParams.minMatch = (params->cParams).strategy;
  cParams.targetLength = in_stack_ffffffffffffff54;
  cParams.strategy = in_stack_ffffffffffffff58;
  code = ZSTD_checkCParams(cParams);
  uVar5 = ERR_isError(code);
  if (uVar5 == 0) {
    if ((dict != (void *)0x0) && (cdict != (ZSTD_CDict *)0x0)) {
      __assert_fail("!((dict) && (cdict))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1397,
                    "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) ||
        ((0x1ffff < pledgedSrcSize &&
         (((cdict->dictContentSize * 6 <= pledgedSrcSize && (pledgedSrcSize != 0xffffffffffffffff))
          && (cdict->compressionLevel != 0)))))) || (params->attachDictPref == ZSTD_dictForceLoad))
    {
      cctx_local = (ZSTD_CCtx *)
                   ZSTD_resetCCtx_internal
                             (cctx,params,pledgedSrcSize,local_90,ZSTDcrp_makeClean,zbuff);
      uVar5 = ERR_isError((size_t)cctx_local);
      if (uVar5 == 0) {
        if (cdict == (ZSTD_CDict *)0x0) {
          local_a0 = (ZSTD_CCtx *)
                     ZSTD_compress_insertDictionary
                               ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,
                                &cctx->ldmState,&cctx->workspace,&cctx->appliedParams,dict,dictSize,
                                dictContentType,dtlm,ZSTD_tfp_forCCtx,cctx->entropyWorkspace);
        }
        else {
          local_a0 = (ZSTD_CCtx *)
                     ZSTD_compress_insertDictionary
                               ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,
                                &cctx->ldmState,&cctx->workspace,&cctx->appliedParams,
                                cdict->dictContent,cdict->dictContentSize,cdict->dictContentType,
                                dtlm,ZSTD_tfp_forCCtx,cctx->entropyWorkspace);
        }
        uVar5 = ERR_isError((size_t)local_a0);
        if (uVar5 == 0) {
          if ((ZSTD_CCtx *)0xffffffff < local_a0) {
            __assert_fail("dictID <= UINT_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x13b0,
                          "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                         );
          }
          cctx->dictID = (U32)local_a0;
          cctx->dictContentSize = local_90;
          cctx_local = (ZSTD_CCtx *)0x0;
        }
        else {
          cctx_local = local_a0;
        }
      }
    }
    else {
      cctx_local = (ZSTD_CCtx *)ZSTD_resetCCtx_usingCDict(cctx,cdict,params,pledgedSrcSize,zbuff);
    }
    return (size_t)cctx_local;
  }
  __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x1396,
                "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
               );
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        ZSTD_tfp_forCCtx, cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, ZSTD_tfp_forCCtx, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}